

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O0

bool __thiscall
Js::JavascriptStaticEnumerator::Initialize
          (JavascriptStaticEnumerator *this,JavascriptEnumerator *prefixEnumerator,
          ArrayObject *arrayToEnumerate,DynamicObject *objectToEnumerate,EnumeratorFlags flags,
          ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  JavascriptEnumerator **ppJVar3;
  DynamicObject *pDVar4;
  JavascriptEnumerator *local_50;
  JavascriptEnumerator *local_48;
  ScriptContext *requestContext_local;
  EnumeratorFlags flags_local;
  DynamicObject *objectToEnumerate_local;
  ArrayObject *arrayToEnumerate_local;
  JavascriptEnumerator *prefixEnumerator_local;
  JavascriptStaticEnumerator *this_local;
  
  pDVar4 = objectToEnumerate;
  Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator=
            (&this->prefixEnumerator,prefixEnumerator);
  if (arrayToEnumerate == (ArrayObject *)0x0) {
    local_48 = (JavascriptEnumerator *)0x0;
  }
  else {
    iVar2 = (*(arrayToEnumerate->super_DynamicObject).super_RecyclableObject.super_FinalizableObject
              .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6f])
                      (arrayToEnumerate,(ulong)flags,requestContext,
                       CONCAT71((int7)((ulong)pDVar4 >> 8),flags));
    local_48 = (JavascriptEnumerator *)CONCAT44(extraout_var,iVar2);
  }
  Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator=(&this->arrayEnumerator,local_48);
  local_50 = prefixEnumerator;
  if (prefixEnumerator == (JavascriptEnumerator *)0x0) {
    ppJVar3 = Memory::PointerValue<Js::JavascriptEnumerator>(&this->arrayEnumerator);
    local_50 = *ppJVar3;
  }
  Memory::WriteBarrierPtr<Js::JavascriptEnumerator>::operator=(&this->currentEnumerator,local_50);
  bVar1 = DynamicObjectPropertyEnumerator::Initialize
                    (&this->propertyEnumerator,objectToEnumerate,flags,requestContext,
                     enumeratorCache);
  return bVar1;
}

Assistant:

bool JavascriptStaticEnumerator::Initialize(JavascriptEnumerator * prefixEnumerator, ArrayObject * arrayToEnumerate,
        DynamicObject * objectToEnumerate, EnumeratorFlags flags, ScriptContext * requestContext, EnumeratorCache * enumeratorCache)
    {
        this->prefixEnumerator = prefixEnumerator;
        this->arrayEnumerator = arrayToEnumerate ? arrayToEnumerate->GetIndexEnumerator(flags, requestContext) : nullptr;
        this->currentEnumerator = prefixEnumerator ? prefixEnumerator : PointerValue(arrayEnumerator);
        return this->propertyEnumerator.Initialize(objectToEnumerate, flags, requestContext, enumeratorCache);
    }